

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O0

int mult_argument(char *argument,char *arg)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  int number;
  char *pdot;
  char *local_20;
  
  local_20 = in_RDI;
  while( true ) {
    if (*local_20 == '\0') {
      strcpy(in_RSI,in_RDI);
      return 1;
    }
    if (*local_20 == '*') break;
    local_20 = local_20 + 1;
  }
  *local_20 = '\0';
  iVar1 = atoi(in_RDI);
  *local_20 = '*';
  strcpy(in_RSI,local_20 + 1);
  return iVar1;
}

Assistant:

int mult_argument(char *argument, char *arg)
{
	char *pdot;
	int number;

	for (pdot = argument; *pdot != '\0'; pdot++)
	{
		if (*pdot == '*')
		{
			*pdot = '\0';
			number = atoi(argument);
			*pdot = '*';

			strcpy(arg, pdot + 1);
			return number;
		}
	}

	strcpy(arg, argument);
	return 1;
}